

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro.c
# Opt level: O2

int coro_stack_alloc(coro_stack *stack,uint size)

{
  size_t __len;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  void *__addr;
  ulong uVar4;
  
  uVar4 = 0x40000;
  if (size != 0) {
    uVar4 = (ulong)size;
  }
  stack->sptr = (void *)0x0;
  sVar1 = coro_pagesize();
  sVar2 = coro_pagesize();
  sVar3 = coro_pagesize();
  sVar3 = sVar3 * (((sVar1 + uVar4 * 8) - 1) / sVar2);
  stack->ssze = sVar3;
  sVar1 = coro_pagesize();
  __len = sVar3 + sVar1 * 4;
  __addr = mmap((void *)0x0,__len,7,0x22,-1,0);
  if ((__addr == (void *)0xffffffffffffffff) &&
     (__addr = mmap((void *)0x0,__len,3,0x22,-1,0), __addr == (void *)0xffffffffffffffff)) {
    return 0;
  }
  sVar1 = coro_pagesize();
  mprotect(__addr,sVar1 * 4,0);
  sVar1 = coro_pagesize();
  stack->sptr = (void *)((long)__addr + sVar1 * 4);
  return 1;
}

Assistant:

int
coro_stack_alloc (struct coro_stack *stack, unsigned int size)
{
  if (!size)
    size = 256 * 1024;

  stack->sptr = 0;
  stack->ssze = ((size_t)size * sizeof (void *) + PAGESIZE - 1) / PAGESIZE * PAGESIZE;

#if CORO_FIBER

  stack->sptr = (void *)stack;
  return 1;

#else

  size_t ssze = stack->ssze + CORO_GUARDPAGES * PAGESIZE;
  void *base;

  #if CORO_MMAP
    /* mmap supposedly does allocate-on-write for us */
    base = mmap (0, ssze, PROT_READ | PROT_WRITE | PROT_EXEC, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);

    if (base == (void *)-1)
      {
        /* some systems don't let us have executable heap */
        /* we assume they won't need executable stack in that case */
        base = mmap (0, ssze, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);

        if (base == (void *)-1)
          return 0;
      }

    #if CORO_GUARDPAGES
      mprotect (base, CORO_GUARDPAGES * PAGESIZE, PROT_NONE);
    #endif

    base = (void*)((char *)base + CORO_GUARDPAGES * PAGESIZE);
  #else
    base = malloc (ssze);
    if (!base)
      return 0;
  #endif

  #if CORO_USE_VALGRIND
    stack->valgrind_id = VALGRIND_STACK_REGISTER ((char *)base, ((char *)base) + ssze - CORO_GUARDPAGES * PAGESIZE);
  #endif

  stack->sptr = base;
  return 1;

#endif
}